

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

size_t __thiscall VmaBlockMetadata_Linear::GetAllocationCount(VmaBlockMetadata_Linear *this)

{
  bool bVar1;
  
  bVar1 = this->m_1stVectorIndex == 0;
  return ((&this->m_Suballocations0)[!bVar1].m_Count + (&this->m_Suballocations0)[bVar1].m_Count) -
         (this->m_1stNullItemsBeginCount + this->m_1stNullItemsMiddleCount +
         this->m_2ndNullItemsCount);
}

Assistant:

const SuballocationVectorType& AccessSuballocations1st() const { return m_1stVectorIndex ? m_Suballocations1 : m_Suballocations0; }